

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAGetQuadDky(void *ida_mem,sunrealtype t,int k,N_Vector dkyQ)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  IDAMem in_XMM0_Qa;
  sunrealtype cjk_1 [6];
  sunrealtype cjk [6];
  int retval;
  int j;
  int i;
  sunrealtype psij_1;
  sunrealtype delt;
  sunrealtype tp;
  sunrealtype tfuzz;
  IDAMem IDA_mem;
  double adStack_c8 [6];
  double local_98 [8];
  int local_58;
  int local_54;
  sunrealtype local_50;
  double local_48;
  double local_40;
  double local_38;
  IDAMem local_30;
  long local_28;
  int local_1c;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xcb4,"IDAGetQuadDky",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_quadr == 1) {
    if (in_RDX == 0) {
      IDAProcessError(in_RDI,-0x1b,0xcc6,"IDAGetQuadDky",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                      ,"dky = NULL illegal.");
      local_4 = -0x1b;
    }
    else if ((in_ESI < 0) || (in_RDI->ida_kk < in_ESI)) {
      IDAProcessError(in_RDI,-0x19,0xcce,"IDAGetQuadDky",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                      ,"Illegal value for k.");
      local_4 = -0x19;
    }
    else {
      local_38 = in_RDI->ida_uround * 100.0 * (in_RDI->ida_tn + in_RDI->ida_hh);
      local_40 = (in_RDI->ida_tn - in_RDI->ida_hused) - local_38;
      if (0.0 <= ((double)in_XMM0_Qa - local_40) * in_RDI->ida_hh) {
        for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
          local_98[local_54] = 0.0;
          adStack_c8[local_54] = 0.0;
        }
        local_48 = (double)in_XMM0_Qa - in_RDI->ida_tn;
        local_30 = in_RDI;
        local_28 = in_RDX;
        local_1c = in_ESI;
        for (local_54 = 0; local_54 <= local_1c; local_54 = local_54 + 1) {
          if (local_54 == 0) {
            local_98[0] = 1.0;
            local_50 = 0.0;
          }
          else {
            local_98[local_54] =
                 (local_98[local_54 + -1] * (double)local_54) / local_30->ida_psi[local_54 + -1];
            local_50 = local_30->ida_psi[local_54 + -1];
          }
          for (local_58 = local_54 + 1; local_58 <= (local_30->ida_kused - local_1c) + local_54;
              local_58 = local_58 + 1) {
            local_98[local_58] =
                 ((double)local_54 * adStack_c8[local_58 + -1] +
                 local_98[local_58 + -1] * (local_48 + local_50)) / local_30->ida_psi[local_58 + -1]
            ;
            local_50 = local_30->ida_psi[local_58 + -1];
          }
          for (local_58 = local_54 + 1; local_58 <= (local_30->ida_kused - local_1c) + local_54;
              local_58 = local_58 + 1) {
            adStack_c8[local_58] = local_98[local_58];
          }
        }
        iVar1 = N_VLinearCombination
                          ((local_30->ida_kused - local_1c) + 1,local_98 + local_1c,
                           local_30->ida_phiQ + local_1c,local_28);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = -0x1c;
        }
      }
      else {
        IDAProcessError(in_XMM0_Qa,(int)(in_RDI->ida_tn - in_RDI->ida_hused),(int)in_RDI->ida_tn,
                        (char *)in_RDI,(char *)0xffffffe6,(char *)0xcd9,"IDAGetQuadDky",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                        ,
                        "Illegal value for t.t = %.15g is not between tcur - hold = %.15g and tcur = %.15g"
                       );
        local_4 = -0x1a;
      }
    }
  }
  else {
    IDAProcessError(in_RDI,-0x1e,0xcbe,"IDAGetQuadDky",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Illegal attempt to call before calling IDAQuadInit.");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

int IDAGetQuadDky(void* ida_mem, sunrealtype t, int k, N_Vector dkyQ)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, psij_1;
  int i, j, retval;
  sunrealtype cjk[MXORDP1];
  sunrealtype cjk_1[MXORDP1];

  /* Check ida_mem */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if quadrature was initialized */
  if (IDA_mem->ida_quadr != SUNTRUE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUAD, __LINE__, __func__, __FILE__,
                    MSG_NO_QUAD);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUAD);
  }

  if (dkyQ == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kk))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround * (IDA_mem->ida_tn + IDA_mem->ida_hh);
  tp    = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_T);
  }

  /* Initialize the c_j^(k) and c_k^(k-1) */
  for (i = 0; i < MXORDP1; i++)
  {
    cjk[i]   = 0;
    cjk_1[i] = 0;
  }
  delt = t - IDA_mem->ida_tn;

  for (i = 0; i <= k; i++)
  {
    if (i == 0)
    {
      cjk[i] = 1;
      psij_1 = 0;
    }
    else
    {
      cjk[i] = cjk[i - 1] * i / IDA_mem->ida_psi[i - 1];
      psij_1 = IDA_mem->ida_psi[i - 1];
    }

    /* update c_j^(i) */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++)
    {
      cjk[j] = (i * cjk_1[j - 1] + cjk[j - 1] * (delt + psij_1)) /
               IDA_mem->ida_psi[j - 1];
      psij_1 = IDA_mem->ida_psi[j - 1];
    }

    /* save existing c_j^(i)'s */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++) { cjk_1[j] = cjk[j]; }
  }

  /* Compute sum (c_j(t) * phi(t)) */

  retval = N_VLinearCombination(IDA_mem->ida_kused - k + 1, cjk + k,
                                IDA_mem->ida_phiQ + k, dkyQ);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}